

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

void __thiscall sentencepiece::SentencePieceText::Clear(SentencePieceText *this)

{
  void **ppvVar1;
  Rep *pRVar2;
  void *pvVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  google::protobuf::internal::ExtensionSet::Clear(&this->_extensions_);
  lVar7 = (long)(this->pieces_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar2 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      ppvVar1 = pRVar2->elements + lVar6;
      lVar6 = lVar6 + 1;
      SentencePieceText_SentencePiece::Clear((SentencePieceText_SentencePiece *)*ppvVar1);
    } while (lVar7 != lVar6);
    (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    puVar4 = (undefined8 *)((ulong)(this->text_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    puVar4[1] = 0;
    *(undefined1 *)*puVar4 = 0;
  }
  this->score_ = 0.0;
  (this->_has_bits_).has_bits_[0] = 0;
  pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    uVar5 = (ulong)pvVar3 & 0xfffffffffffffffe;
    *(undefined8 *)(uVar5 + 0x10) = 0;
    **(undefined1 **)(uVar5 + 8) = 0;
  }
  return;
}

Assistant:

void SentencePieceText::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.SentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  pieces_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    text_.ClearNonDefaultToEmpty();
  }
  score_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}